

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

bool __thiscall ftxui::WideInputBase::OnMouseEvent(WideInputBase *this,Event *event)

{
  wstring *pwVar1;
  InputOption *pIVar2;
  bool bVar3;
  _func_int **in_RAX;
  int *piVar4;
  wstring *pwVar5;
  int iVar6;
  InputOption *this_00;
  pointer *__ptr;
  int iVar7;
  _func_int **local_28;
  
  local_28 = in_RAX;
  ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
  if (local_28 != (_func_int **)0x0) {
    (**(code **)(*local_28 + 8))();
    bVar3 = Box::Contain(&this->input_box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y);
    if (bVar3) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      if ((event->field_1).mouse_.button != Left) {
        return true;
      }
      if ((event->field_1).mouse_.motion != Pressed) {
        return true;
      }
      piVar4 = cursor_position(this);
      iVar6 = ((event->field_1).mouse_.x + *piVar4) - (this->cursor_box_).x_min;
      pwVar1 = (this->content_).address_;
      pwVar5 = &(this->content_).owned_;
      if (pwVar1 != (wstring *)0x0) {
        pwVar5 = pwVar1;
      }
      iVar7 = (int)pwVar5->_M_string_length;
      if (iVar7 <= iVar6) {
        iVar6 = iVar7;
      }
      iVar7 = 0;
      if (0 < iVar6) {
        iVar7 = iVar6;
      }
      piVar4 = cursor_position(this);
      if (*piVar4 == iVar7) {
        return true;
      }
      piVar4 = cursor_position(this);
      *piVar4 = iVar7;
      pIVar2 = (this->option_).address_;
      this_00 = &(this->option_).owned_;
      if (pIVar2 != (InputOption *)0x0) {
        this_00 = pIVar2;
      }
      std::function<void_()>::operator()(&this_00->on_change);
      return true;
    }
  }
  return false;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (!input_box_.Contain(event.mouse().x, event.mouse().y))
      return false;

    TakeFocus();

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed) {
      int new_cursor_position =
          cursor_position() + event.mouse().x - cursor_box_.x_min;
      new_cursor_position =
          std::max(0, std::min<int>(content_->size(), new_cursor_position));
      if (cursor_position() != new_cursor_position) {
        cursor_position() = new_cursor_position;
        option_->on_change();
      }
    }
    return true;
  }